

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *frame_bb,ImGuiID id,float *v,float v_min,float v_max,float power,
               int decimal_precision,ImGuiSliderFlags flags)

{
  ImVec2 p_min;
  ImVec2 p_max;
  ImDrawList *this;
  bool bVar1;
  ImGuiContext *pIVar2;
  ImU32 IVar3;
  ImGuiWindow *pIVar4;
  ImGuiCol idx;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImRect local_e8;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImRect local_c8;
  undefined1 local_b8 [8];
  ImRect grab_bb;
  float grab_pos;
  float grab_t;
  float a_1;
  float a;
  float new_value;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  float linear_dist_max_to_0;
  float linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_horizontal;
  bool is_non_linear;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiSliderFlags flags_local;
  int decimal_precision_local;
  float power_local;
  float v_max_local;
  float v_min_local;
  float *v_local;
  ImGuiID id_local;
  ImRect *frame_bb_local;
  
  pIVar2 = GImGui;
  pIVar4 = GetCurrentWindow();
  p_min = frame_bb->Min;
  p_max = frame_bb->Max;
  IVar3 = GetColorU32(7,1.0);
  RenderFrame(p_min,p_max,IVar3,true,(pIVar2->Style).FrameRounding);
  bVar5 = (flags & 1U) != 0;
  if (bVar5) {
    local_100 = ImRect::GetHeight(frame_bb);
  }
  else {
    local_100 = ImRect::GetWidth(frame_bb);
  }
  local_100 = local_100 - 4.0;
  if (decimal_precision == 0) {
    if (v_max <= v_min) {
      local_108 = v_min - v_max;
    }
    else {
      local_108 = v_max - v_min;
    }
    fVar6 = ImMax((local_100 / (local_108 + 1.0)) * 1.0,(pIVar2->Style).GrabMinSize);
    slider_usable_pos_min = ImMin(fVar6,local_100);
  }
  else {
    slider_usable_pos_min = ImMin((pIVar2->Style).GrabMinSize,local_100);
  }
  if (bVar5) {
    local_10c = (frame_bb->Min).y;
  }
  else {
    local_10c = (frame_bb->Min).x;
  }
  fVar6 = slider_usable_pos_min * 0.5 + local_10c + 2.0;
  if (bVar5) {
    local_110 = (frame_bb->Max).y;
  }
  else {
    local_110 = (frame_bb->Max).x;
  }
  if (0.0 <= v_min * v_max) {
    linear_dist_max_to_0 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    fVar7 = powf(ABS(0.0 - v_min),1.0 / power);
    fVar8 = powf(ABS(v_max - 0.0),1.0 / power);
    linear_dist_max_to_0 = fVar7 / (fVar7 + fVar8);
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar2->ActiveId == id) {
    bVar1 = false;
    new_value = 0.0;
    if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
      ClearActiveID();
    }
    else {
      if (bVar5) {
        local_114 = (pIVar2->IO).MousePos.y;
      }
      else {
        local_114 = (pIVar2->IO).MousePos.x;
      }
      if (local_100 - slider_usable_pos_min <= 0.0) {
        local_118 = 0.0;
      }
      else {
        local_118 = ImClamp((local_114 - fVar6) / (local_100 - slider_usable_pos_min),0.0,1.0);
      }
      new_value = local_118;
      if (bVar5) {
        new_value = 1.0 - local_118;
      }
      bVar1 = true;
    }
    if (bVar1) {
      if (0.99999 <= power && power <= 1.00001) {
        a_1 = ImLerp(v_min,v_max,new_value);
      }
      else if (linear_dist_max_to_0 <= new_value) {
        if (ABS(linear_dist_max_to_0 - 1.0) <= 1e-06) {
          grab_pos = new_value;
        }
        else {
          grab_pos = (new_value - linear_dist_max_to_0) / (1.0 - linear_dist_max_to_0);
        }
        fVar7 = powf(grab_pos,power);
        fVar8 = ImMax(v_min,0.0);
        a_1 = ImLerp(fVar8,v_max,fVar7);
      }
      else {
        fVar7 = powf(1.0 - new_value / linear_dist_max_to_0,power);
        fVar8 = ImMin(v_max,0.0);
        a_1 = ImLerp(fVar8,v_min,fVar7);
      }
      fVar7 = RoundScalar(a_1,decimal_precision);
      if ((*v != fVar7) || (NAN(*v) || NAN(fVar7))) {
        *v = fVar7;
        mouse_abs_pos._3_1_ = true;
      }
    }
  }
  grab_bb.Max.y = SliderBehaviorCalcRatioFromValue(*v,v_min,v_max,power,linear_dist_max_to_0);
  if (bVar5) {
    grab_bb.Max.y = 1.0 - grab_bb.Max.y;
  }
  grab_bb.Max.x = ImLerp(fVar6,-slider_usable_pos_min * 0.5 + (local_110 - 2.0),grab_bb.Max.y);
  ImRect::ImRect((ImRect *)local_b8);
  if (bVar5) {
    ImVec2::ImVec2(&local_f0,(frame_bb->Min).x + 2.0,-slider_usable_pos_min * 0.5 + grab_bb.Max.x);
    ImVec2::ImVec2(&local_f8,(frame_bb->Max).x - 2.0,slider_usable_pos_min * 0.5 + grab_bb.Max.x);
    ImRect::ImRect(&local_e8,&local_f0,&local_f8);
    local_b8._0_4_ = local_e8.Min.x;
    local_b8._4_4_ = local_e8.Min.y;
    grab_bb.Min = local_e8.Max;
  }
  else {
    ImVec2::ImVec2(&local_d0,-slider_usable_pos_min * 0.5 + grab_bb.Max.x,(frame_bb->Min).y + 2.0);
    ImVec2::ImVec2(&local_d8,slider_usable_pos_min * 0.5 + grab_bb.Max.x,(frame_bb->Max).y - 2.0);
    ImRect::ImRect(&local_c8,&local_d0,&local_d8);
    local_b8._0_4_ = local_c8.Min.x;
    local_b8._4_4_ = local_c8.Min.y;
    grab_bb.Min = local_c8.Max;
  }
  this = pIVar4->DrawList;
  idx = 0x14;
  if (pIVar2->ActiveId == id) {
    idx = 0x15;
  }
  IVar3 = GetColorU32(idx,1.0);
  ImDrawList::AddRectFilled
            (this,(ImVec2 *)local_b8,&grab_bb.Min,IVar3,(pIVar2->Style).GrabRounding,-1);
  return mouse_abs_pos._3_1_;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& frame_bb, ImGuiID id, float* v, float v_min, float v_max, float power, int decimal_precision, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = g.Style;

    // Draw frame
    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const bool is_non_linear = (power < 1.0f-0.00001f) || (power > 1.0f+0.00001f);
    const bool is_horizontal = (flags & ImGuiSliderFlags_Vertical) == 0;

    const float grab_padding = 2.0f;
    const float slider_sz = is_horizontal ? (frame_bb.GetWidth() - grab_padding * 2.0f) : (frame_bb.GetHeight() - grab_padding * 2.0f);
    float grab_sz;
    if (decimal_precision != 0)
        grab_sz = ImMin(style.GrabMinSize, slider_sz);
    else
        grab_sz = ImMin(ImMax(1.0f * (slider_sz / ((v_min < v_max ? v_max - v_min : v_min - v_max) + 1.0f)), style.GrabMinSize), slider_sz);  // Integer sliders, if possible have the grab size represent 1 unit
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = (is_horizontal ? frame_bb.Min.x : frame_bb.Min.y) + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = (is_horizontal ? frame_bb.Max.x : frame_bb.Max.y) - grab_padding - grab_sz*0.5f;

    // For logarithmic sliders that cross over sign boundary we want the exponential increase to be symmetric around 0.0f
    float linear_zero_pos = 0.0f;   // 0.0->1.0f
    if (v_min * v_max < 0.0f)
    {
        // Different sign
        const float linear_dist_min_to_0 = powf(fabsf(0.0f - v_min), 1.0f/power);
        const float linear_dist_max_to_0 = powf(fabsf(v_max - 0.0f), 1.0f/power);
        linear_zero_pos = linear_dist_min_to_0 / (linear_dist_min_to_0+linear_dist_max_to_0);
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process clicking on the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.IO.MouseDown[0])
        {
            const float mouse_abs_pos = is_horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
            clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
            if (!is_horizontal)
                clicked_t = 1.0f - clicked_t;
            set_new_value = true;
        }
        else
        {
            ClearActiveID();
        }

        if (set_new_value)
        {
            float new_value;
            if (is_non_linear)
            {
                // Account for logarithmic scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = powf(a, power);
                    new_value = ImLerp(ImMin(v_max,0.0f), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (fabsf(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = powf(a, power);
                    new_value = ImLerp(ImMax(v_min,0.0f), v_max, a);
                }
            }
            else
            {
                // Linear slider
                new_value = ImLerp(v_min, v_max, clicked_t);
            }

            // Round past decimal precision
            new_value = RoundScalar(new_value, decimal_precision);
            if (*v != new_value)
            {
                *v = new_value;
                value_changed = true;
            }
        }
    }

    // Draw
    float grab_t = SliderBehaviorCalcRatioFromValue(*v, v_min, v_max, power, linear_zero_pos);
    if (!is_horizontal)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    ImRect grab_bb;
    if (is_horizontal)
        grab_bb = ImRect(ImVec2(grab_pos - grab_sz*0.5f, frame_bb.Min.y + grab_padding), ImVec2(grab_pos + grab_sz*0.5f, frame_bb.Max.y - grab_padding));
    else
        grab_bb = ImRect(ImVec2(frame_bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f), ImVec2(frame_bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f));
    window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    return value_changed;
}